

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_logging.cpp
# Opt level: O3

void __thiscall cubeb_logging_Test::TestBody(cubeb_logging_Test *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  anon_enum_32 *__s2;
  undefined8 in_RCX;
  anon_enum_32 *paVar4;
  uint uVar5;
  cubeb *context;
  cubeb_stream *stream_00;
  bool bVar6;
  Message local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  __atomic_base<unsigned_int> local_80;
  undefined4 uStack_7c;
  AssertHelper local_78;
  cubeb_stream *local_70;
  cubeb *local_68;
  uint32_t latency_frames;
  int r;
  cubeb_stream *stream;
  cubeb *ctx;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  cubeb_stream_prefs local_38;
  
  latency_frames = 0;
  cubeb_set_log_callback(CUBEB_LOG_NORMAL,test_logging_callback);
  pcVar3 = getenv("CUBEB_BACKEND");
  iVar1 = cubeb_init(&ctx,"Cubeb logging test",pcVar3);
  paVar4 = (anon_enum_32 *)CONCAT71((int7)((ulong)in_RCX >> 8),pcVar3 == (char *)0x0 || iVar1 != 0);
  if (pcVar3 != (char *)0x0 && iVar1 == 0) {
    __s2 = (anon_enum_32 *)cubeb_get_backend_id(ctx);
    iVar2 = strcmp(pcVar3,(char *)__s2);
    if (iVar2 != 0) {
      fprintf(_stderr,"Requested backend `%s\', got `%s\'\n",pcVar3);
      paVar4 = __s2;
    }
  }
  local_90.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  r = iVar1;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            (local_48,(char *)&r,(int *)&local_90,paVar4);
  if (local_48[0] == CUBEB_SAMPLE_S16LE) {
    testing::Message::Message(&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (CONCAT44(local_90.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_90.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) + 0x10),"Error initializing cubeb library",0x20);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stream,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_logging.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stream,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stream);
    if ((long *)CONCAT44(local_90.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_90.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_90.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
    return;
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
  }
  context = ctx;
  local_48._0_4_ = CUBEB_SAMPLE_FLOAT32LE;
  local_48._4_4_ = 48000;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000002;
  local_38 = CUBEB_STREAM_PREF_NONE;
  r = cubeb_get_min_latency(ctx,(cubeb_stream_params *)local_48,&latency_frames);
  if (r != 0) {
    latency_frames = 0x400;
  }
  paVar4 = (anon_enum_32 *)0x0;
  r = cubeb_stream_init(ctx,&stream,"Cubeb logging",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                        (cubeb_devid)0x0,(cubeb_stream_params *)local_48,latency_frames,data_cb_load
                        ,state_cb,(void *)0x0);
  local_80._M_i = 0;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            ((char *)&local_90,(char *)&r,(int *)&local_80,paVar4);
  if (local_90.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT44(uStack_7c,local_80._M_i) + 0x10),
               "Error initializing cubeb stream",0x1f);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_logging.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(uStack_7c,local_80._M_i) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_7c,local_80._M_i) + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    goto LAB_00109db1;
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  stream_00 = stream;
  local_80 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
            ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)","0u",
             &local_80._M_i,(uint *)&local_78);
  if (local_90.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    iVar1 = 0x7a;
LAB_00109d65:
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/test/test_logging.cpp"
               ,iVar1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((long *)CONCAT44(uStack_7c,local_80._M_i) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_7c,local_80._M_i) + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  else {
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    cubeb_set_log_callback(CUBEB_LOG_DISABLED,(cubeb_log_callback)0x0);
    log_statements_received.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
    cubeb_stream_start(stream);
    local_80 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
    local_78.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)","0u",
               &local_80._M_i,(uint *)&local_78);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      iVar1 = 0x83;
      goto LAB_00109d65;
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    cubeb_set_log_callback(CUBEB_LOG_VERBOSE,test_logging_callback);
    wait_for_audio_callback();
    local_80 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
    local_78.data_._0_4_ = 0;
    testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
              ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)","0u",
               &local_80._M_i,(uint *)&local_78);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      iVar1 = 0x89;
      goto LAB_00109d65;
    }
    local_70 = stream_00;
    local_68 = context;
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    uVar5 = 99;
    do {
      wait_for_audio_callback();
      if ((uVar5 & 1) == 0) {
        local_80 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
        local_78.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)",
                   "0u",&local_80._M_i,(uint *)&local_78);
        if (local_90.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_88->_M_dataplus)._M_p;
          }
          iVar1 = 0x91;
          context = local_68;
          stream_00 = local_70;
          goto LAB_00109d65;
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
        cubeb_set_log_callback(CUBEB_LOG_VERBOSE,test_logging_callback);
      }
      else {
        local_80 = log_statements_received.super___atomic_base<unsigned_int>._M_i;
        local_78.data_._0_4_ = 0;
        testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
                  ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)",
                   "0u",&local_80._M_i,(uint *)&local_78);
        if (local_90.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_88->_M_dataplus)._M_p;
          }
          iVar1 = 0x97;
          context = local_68;
          stream_00 = local_70;
          goto LAB_00109d65;
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
        cubeb_set_log_callback(CUBEB_LOG_DISABLED,(cubeb_log_callback)0x0);
        log_statements_received.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)0;
        local_80._M_i = 0;
        local_78.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&local_90,"log_statements_received.load(std::memory_order_acquire)",
                   "0u",&local_80._M_i,(uint *)&local_78);
        if (local_90.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = "";
          }
          else {
            pcVar3 = (local_88->_M_dataplus)._M_p;
          }
          iVar1 = 0x9c;
          context = local_68;
          stream_00 = local_70;
          goto LAB_00109d65;
        }
        if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_88,local_88);
        }
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
    cubeb_stream_stop(stream);
    context = local_68;
    stream_00 = local_70;
  }
  if (stream_00 != (cubeb_stream *)0x0) {
    cubeb_stream_destroy(stream_00);
  }
LAB_00109db1:
  if (context != (cubeb *)0x0) {
    cubeb_destroy(context);
  }
  return;
}

Assistant:

TEST(cubeb, logging)
{
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params output_params;
  int r;
  uint32_t latency_frames = 0;

  cubeb_set_log_callback(CUBEB_LOG_NORMAL, test_logging_callback);

  r = common_init(&ctx, "Cubeb logging test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)> cleanup_cubeb_at_exit(
      ctx, cubeb_destroy);

  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 48000;
  output_params.channels = 2;
  output_params.layout = CUBEB_LAYOUT_STEREO;
  output_params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_get_min_latency(ctx, &output_params, &latency_frames);
  if (r != CUBEB_OK) {
    // not fatal
    latency_frames = 1024;
  }

  r = cubeb_stream_init(ctx, &stream, "Cubeb logging", NULL, NULL, NULL,
                        &output_params, latency_frames, data_cb_load, state_cb,
                        NULL);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";

  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
      cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);

  cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr);
  log_statements_received.store(0, std::memory_order_release);

  // This is synchronous and we'll receive log messages on all backends that we
  // test
  cubeb_stream_start(stream);

  ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);

  cubeb_set_log_callback(CUBEB_LOG_VERBOSE, test_logging_callback);

  wait_for_audio_callback();

  ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);

  bool log_callback_set = true;
  uint32_t iterations = 100;
  while (iterations--) {
    wait_for_audio_callback();

    if (!log_callback_set) {
      ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);
      // Set a logging callback, start logging
      cubeb_set_log_callback(CUBEB_LOG_VERBOSE, test_logging_callback);
      log_callback_set = true;
    } else {
      // Disable the logging callback, stop logging.
      ASSERT_NE(log_statements_received.load(std::memory_order_acquire), 0u);
      cubeb_set_log_callback(CUBEB_LOG_DISABLED, nullptr);
      log_statements_received.store(0, std::memory_order_release);
      // Disabling logging should flush any log message -- wait a bit and check
      // that this is true.
      ASSERT_EQ(log_statements_received.load(std::memory_order_acquire), 0u);
      log_callback_set = false;
    }
  }

  cubeb_stream_stop(stream);
}